

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

Argument * __thiscall argparse::Argument::default_value<int>(Argument *this,int *value)

{
  uint uVar1;
  uint __val;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint __len;
  string __str;
  string local_50;
  
  NArgsRange::NArgsRange((NArgsRange *)&local_50,0,(this->m_num_args_range).m_max);
  (this->m_num_args_range).m_min = (size_t)local_50._M_dataplus._M_p;
  (this->m_num_args_range).m_max = local_50._M_string_length;
  details::repr<int>(&local_50,value);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_default_value_repr,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  uVar1 = *value;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar4 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar3 = (uint)uVar4;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_0011ba2f;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_0011ba2f;
      }
      if (uVar3 < 10000) goto LAB_0011ba2f;
      uVar4 = uVar4 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_0011ba2f:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_50,(ulong)(-((int)uVar1 >> 0x1f) + __len),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_50._M_dataplus._M_p + (uint)-((int)uVar1 >> 0x1f),__len,__val);
  std::optional<std::__cxx11::string>::operator=
            ((optional<std::__cxx11::string> *)&this->m_default_value_str,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::any::operator=(&this->m_default_value,value);
  return this;
}

Assistant:

Argument &default_value(T &&value) {
    m_num_args_range = NArgsRange{0, m_num_args_range.get_max()};
    m_default_value_repr = details::repr(value);

    if constexpr (std::is_convertible_v<T, std::string_view>) {
      m_default_value_str = std::string{std::string_view{value}};
    } else if constexpr (details::can_invoke_to_string<T>::value) {
      m_default_value_str = std::to_string(value);
    }

    m_default_value = std::forward<T>(value);
    return *this;
  }